

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::PostfixUnaryExpressionSyntax::setChild
          (PostfixUnaryExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  Token TVar2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffa8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffb0;
  undefined8 local_30;
  Info *local_28;
  ExpressionSyntax *local_20;
  not_null<slang::syntax::ExpressionSyntax_*> local_18 [3];
  
  if (in_RSI == 0) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x4a96ef);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_20 = (ExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x4a96ff);
      local_20 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar1);
    }
    not_null<slang::syntax::ExpressionSyntax_*>::not_null<slang::syntax::ExpressionSyntax_*>
              (local_18,&local_20);
    *(ExpressionSyntax **)(in_RDI + 0x18) = local_18[0].ptr;
  }
  else if (in_RSI == 1) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x4a974a);
    SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>(pSVar1);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    TVar2 = ConstTokenOrSyntax::token((ConstTokenOrSyntax *)in_stack_ffffffffffffffa8);
    local_30 = TVar2._0_8_;
    *(undefined8 *)(in_RDI + 0x58) = local_30;
    local_28 = TVar2.info;
    *(Info **)(in_RDI + 0x60) = local_28;
  }
  return;
}

Assistant:

void PostfixUnaryExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: operand = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: operatorToken = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}